

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int store_char(char c,char **buf,int *buf_len,int *used)

{
  FILE *__stream;
  char *pcVar1;
  int *piVar2;
  char *new_buf;
  int *used_local;
  int *buf_len_local;
  char **buf_local;
  char c_local;
  
  if (*used == *buf_len) {
    *buf_len = *buf_len + 0x10;
    pcVar1 = (char *)realloc(*buf,(long)*buf_len);
    __stream = _stderr;
    if (pcVar1 == (char *)0x0) {
      piVar2 = __errno_location();
      pcVar1 = strerror(*piVar2);
      fprintf(__stream,"Memory allocation error (%s).\n",pcVar1);
      return -1;
    }
    *buf = pcVar1;
  }
  (*buf)[*used] = c;
  *used = *used + 1;
  return 0;
}

Assistant:

static int
store_char(char c, char **buf, int *buf_len, int *used)
{
    char *new_buf;

    if (*used == *buf_len) {
        *buf_len += 16;
        new_buf = realloc(*buf, *buf_len * sizeof *new_buf);
        if (!new_buf) {
            fprintf(stderr, "Memory allocation error (%s).\n", strerror(errno));
            return -1;
        }
        *buf = new_buf;
    }

    (*buf)[*used] = c;
    ++(*used);
    return 0;
}